

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressSuperBlock(ZSTD_CCtx *zc,void *dst,size_t dstCapacity,uint lastBlock)

{
  FSE_repeat *pFVar1;
  ZSTD_compressedBlockState_t *__src;
  ZSTD_compressedBlockState_t *tree;
  U32 *workspace;
  byte bVar2;
  uint uVar3;
  symbolEncodingType_e sVar4;
  int iVar5;
  size_t err_code_4;
  BYTE *pBVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  U16 *pUVar12;
  undefined1 *puVar13;
  size_t sVar14;
  uint uVar15;
  long lVar16;
  undefined8 uVar17;
  uint *puVar18;
  ZSTD_fseCTables_t *pZVar19;
  size_t err_code;
  byte *pbVar20;
  BYTE *sourceSize;
  ulong uVar21;
  byte *pbVar22;
  long lVar23;
  FSE_CTable *pFVar24;
  size_t err_code_8;
  byte *pbVar25;
  byte *pbVar26;
  size_t err_code_3;
  ulong uVar27;
  int *piVar28;
  byte *pbVar29;
  bool bVar30;
  byte bVar31;
  ulong uVar32;
  uint max;
  seqDef *sstart;
  ZSTD_compressedBlockState_t *local_510;
  byte local_502;
  byte local_501;
  U32 *local_500;
  BYTE *local_4f8;
  int *local_4f0;
  ulong local_4e8;
  BYTE *local_4e0;
  ZSTD_fseCTables_t *local_4d8;
  BYTE *local_4d0;
  uint *local_4c8;
  BYTE *local_4c0;
  ZSTD_fseCTables_t *local_4b8;
  uint local_4b0;
  uint local_4ac;
  size_t local_4a8;
  BYTE *local_4a0;
  BYTE *local_498;
  ZSTD_CCtx *local_490;
  byte *local_488;
  ZSTD_compressedBlockState_t *local_480;
  BYTE *local_478;
  FSE_CTable *local_470;
  FSE_CTable *local_468;
  uint local_45c;
  ulong local_458;
  U16 *local_450;
  byte *local_448;
  int local_440;
  undefined1 local_43c [500];
  ulong local_248;
  symbolEncodingType_e local_240;
  symbolEncodingType_e local_23c;
  symbolEncodingType_e local_238;
  byte local_234 [500];
  byte *local_40;
  size_t local_38;
  
  __src = (zc->blockState).prevCBlock;
  local_510 = (zc->blockState).nextCBlock;
  puVar18 = zc->entropyWorkspace;
  pBVar6 = (zc->seqStore).litStart;
  sourceSize = (zc->seqStore).lit + -(long)pBVar6;
  max = 0xff;
  local_45c = lastBlock;
  memcpy(local_510,__src,0x404);
  local_440 = 0;
  local_4f8 = (BYTE *)dstCapacity;
  if (sourceSize < (BYTE *)0x40) {
LAB_0010e345:
    local_248 = 0;
  }
  else {
    pBVar6 = (BYTE *)HIST_count_wksp(puVar18,&max,pBVar6,(size_t)sourceSize,puVar18,0x1800);
    tree = local_510;
    if ((BYTE *)0xffffffffffffff88 < pBVar6) {
      return (size_t)pBVar6;
    }
    local_440 = 1;
    if ((pBVar6 == sourceSize) || (local_440 = 0, pBVar6 <= (BYTE *)(((ulong)sourceSize >> 7) + 4)))
    goto LAB_0010e345;
    sstart = (seqDef *)(puVar18 + 0x100);
    memset(local_510,0,0x400);
    uVar15 = max;
    uVar32 = (ulong)max;
    uVar3 = FSE_optimalTableLog_internal(0xb,(size_t)sourceSize,max,1);
    sVar7 = HUF_buildCTable_wksp((HUF_CElt *)tree,puVar18,uVar15,uVar3,sstart,0x1400);
    if (0xffffffffffffff88 < sVar7) {
      return sVar7;
    }
    if ((int)uVar15 < 0) {
      uVar27 = 0;
    }
    else {
      lVar16 = 0;
      uVar27 = 0;
      do {
        uVar27 = uVar27 + (uint)*(byte *)((long)(local_510->entropy).huf.CTable + lVar16 * 4 + 2) *
                          puVar18[lVar16];
        lVar16 = lVar16 + 1;
      } while (uVar32 + 1 != lVar16);
      uVar27 = uVar27 >> 3;
    }
    uVar32 = 0x10f10d;
    sVar7 = HUF_writeCTable(local_43c,500,(HUF_CElt *)local_510,uVar15,(uint)sVar7);
    bVar30 = (BYTE *)(sVar7 + uVar27) < sourceSize;
    local_248 = 0;
    if (bVar30) {
      local_248 = sVar7;
    }
    local_440 = (uint)bVar30 * 2;
    if (0xffffffffffffff88 < local_248) {
      local_4a0 = (BYTE *)dst;
      if (0xffffffffffffff88 < sVar7) {
        return sVar7;
      }
      goto LAB_0010e7a4;
    }
  }
  sstart = (seqDef *)(ulong)(zc->appliedParams).cParams.strategy;
  local_4c0 = (zc->seqStore).ofCode;
  pBVar6 = (zc->seqStore).llCode;
  local_4d0 = (zc->seqStore).mlCode;
  sVar14 = (long)(zc->seqStore).sequences - (long)(zc->seqStore).sequencesStart >> 3;
  local_498 = (BYTE *)dst;
  local_490 = zc;
  memset(puVar18,0,0x1800);
  local_38 = 0;
  ZSTD_seqToCodes(&zc->seqStore);
  max = 0x23;
  local_4b8 = (ZSTD_fseCTables_t *)pBVar6;
  sVar7 = HIST_countFast_wksp(puVar18,&max,pBVar6,sVar14,puVar18,0x1800);
  uVar15 = max;
  pFVar1 = &(local_510->entropy).fse.litlength_repeatMode;
  (local_510->entropy).fse.litlength_repeatMode = (__src->entropy).fse.litlength_repeatMode;
  pFVar24 = (__src->entropy).fse.litlengthCTable;
  local_4e8 = sVar14;
  sVar4 = ZSTD_selectEncodingType
                    (pFVar1,puVar18,max,sVar7,sVar14,9,pFVar24,LL_defaultNorm,6,ZSTD_defaultAllowed,
                     (ZSTD_strategy)sstart);
  uVar27 = local_4e8;
  if ((sVar4 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
    __assert_fail("!(LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x260a,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  local_4c8 = puVar18 + 0x35;
  local_4d8 = (ZSTD_fseCTables_t *)
              ZSTD_buildCTable(local_234,500,(local_510->entropy).fse.litlengthCTable,9,sVar4,
                               puVar18,uVar15,(BYTE *)local_4b8,local_4e8,LL_defaultNorm,6,0x23,
                               pFVar24,0x524,local_4c8,0x172c);
  if (0xffffffffffffff88 < local_4d8) {
    return (size_t)local_4d8;
  }
  local_4b8 = &(__src->entropy).fse;
  if (sVar4 == set_compressed) {
    local_38 = (size_t)local_4d8;
  }
  max = 0x1f;
  local_240 = sVar4;
  sVar7 = HIST_countFast_wksp(puVar18,&max,local_4c0,uVar27,puVar18,0x1800);
  uVar15 = max;
  pFVar1 = &(local_510->entropy).fse.offcode_repeatMode;
  (local_510->entropy).fse.offcode_repeatMode = (__src->entropy).fse.offcode_repeatMode;
  sVar4 = ZSTD_selectEncodingType
                    (pFVar1,puVar18,max,sVar7,uVar27,8,local_4b8->offcodeCTable,OF_defaultNorm,5,
                     (uint)(max < 0x1d),(ZSTD_strategy)sstart);
  zc = local_490;
  if ((sVar4 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
    __assert_fail("!(Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2622,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  pbVar29 = local_234 + (long)local_4d8;
  sVar7 = ZSTD_buildCTable(pbVar29,(long)&local_40 - (long)pbVar29,
                           (local_510->entropy).fse.offcodeCTable,8,sVar4,puVar18,uVar15,local_4c0,
                           uVar27,OF_defaultNorm,5,0x1c,local_4b8->offcodeCTable,0x304,local_4c8,
                           0x172c);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (sVar4 == set_compressed) {
    local_38 = sVar7;
  }
  max = 0x34;
  local_4d8 = (ZSTD_fseCTables_t *)pbVar29;
  local_23c = sVar4;
  sVar14 = HIST_countFast_wksp(puVar18,&max,local_4d0,uVar27,puVar18,0x1800);
  uVar15 = max;
  pFVar1 = &(local_510->entropy).fse.matchlength_repeatMode;
  (local_510->entropy).fse.matchlength_repeatMode = (__src->entropy).fse.matchlength_repeatMode;
  pFVar24 = (__src->entropy).fse.matchlengthCTable;
  sVar4 = ZSTD_selectEncodingType
                    (pFVar1,puVar18,max,sVar14,uVar27,9,pFVar24,ML_defaultNorm,6,ZSTD_defaultAllowed
                     ,(ZSTD_strategy)sstart);
  if ((sVar4 < set_compressed) && (*pFVar1 != FSE_repeat_none)) {
    __assert_fail("!(MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2638,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  pbVar29 = (byte *)((long)local_4d8 + sVar7);
  uVar32 = 0x172c;
  sVar7 = ZSTD_buildCTable(pbVar29,(long)&local_40 - (long)pbVar29,
                           (local_510->entropy).fse.matchlengthCTable,9,sVar4,puVar18,uVar15,
                           local_4d0,uVar27,ML_defaultNorm,6,0x34,pFVar24,0x5ac,local_4c8,0x172c);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (sVar4 == set_compressed) {
    local_38 = sVar7;
  }
  local_40 = pbVar29 + (sVar7 - (long)local_234);
  local_4a0 = local_498;
  local_238 = sVar4;
  if ((byte *)0x1f4 < local_40) {
    __assert_fail("(size_t) (op-ostart) <= sizeof(fseMetadata->fseTablesBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2643,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
LAB_0010e7a4:
  sstart = (zc->seqStore).sequencesStart;
  local_510 = (ZSTD_compressedBlockState_t *)(zc->seqStore).sequences;
  local_4e0 = (zc->seqStore).litStart;
  lVar16 = (long)local_510 - (long)sstart;
  if (lVar16 < 1) {
    lVar23 = 0;
  }
  else {
    pUVar12 = &sstart->matchLength;
    lVar23 = 0;
    do {
      lVar23 = lVar23 + (ulong)*pUVar12 + 3;
      pUVar12 = pUVar12 + 4;
      bVar30 = SCARRY8(lVar16,-8);
      lVar16 = lVar16 + -8;
    } while (lVar16 != 0 && bVar30 == lVar16 < 0);
  }
  local_488 = (zc->seqStore).lit + (lVar23 - (long)local_4e0);
  local_498 = local_4a0;
  if (local_510 <= sstart) {
LAB_0010f0dc:
    if (local_488 == (byte *)0x0) {
      local_4a0 = local_4a0 + -(long)local_498;
    }
    else {
      local_4a0 = (BYTE *)0x0;
    }
    return (size_t)local_4a0;
  }
  local_480 = (zc->blockState).nextCBlock;
  local_458 = (ulong)(uint)zc->bmi2;
  local_500 = zc->entropyWorkspace;
  local_4f8 = local_4a0 + (long)local_4f8;
  local_4c0 = (zc->seqStore).llCode;
  local_4c8 = (uint *)(zc->seqStore).mlCode;
  local_4d0 = (zc->seqStore).ofCode;
  local_448 = (byte *)(zc->appliedParams).targetCBlockSize;
  local_4d8 = &(local_480->entropy).fse;
  local_468 = (local_480->entropy).fse.litlengthCTable;
  local_470 = (local_480->entropy).fse.matchlengthCTable;
  uVar17 = CONCAT71((int7)((ulong)local_480 >> 8),1);
  local_4e8 = 0;
  local_490 = zc;
LAB_0010e8c0:
  local_4f0 = (int *)(local_4a0 + 3);
  local_478 = local_4f8 + (-3 - (long)local_4a0);
  local_4ac = (uint)uVar17;
  local_4b0 = local_4ac & 0xff ^ 3;
  local_450 = &sstart->matchLength;
  local_4b8 = (ZSTD_fseCTables_t *)0x8;
  sVar7 = 0;
  uVar27 = 0;
  do {
    workspace = local_500;
    sVar7 = sVar7 + sstart[uVar27].litLength;
    max = 0xff;
    sVar14 = sVar7;
    if (local_440 != 0) {
      if (local_440 == 2) {
        uVar32 = 0x10e97b;
        sVar8 = HIST_count_wksp(local_500,&max,local_4e0,sVar7,local_500,0x1800);
        if (sVar8 < 0xffffffffffffff89) {
          if ((int)max < 0) {
            lVar16 = 3;
          }
          else {
            lVar16 = 0;
            uVar21 = 0;
            do {
              uVar21 = uVar21 + (uint)*(byte *)((long)(local_480->entropy).huf.CTable +
                                               lVar16 * 4 + 2) * workspace[lVar16];
              lVar16 = lVar16 + 1;
            } while ((ulong)max + 1 != lVar16);
            lVar16 = (uVar21 >> 3) + 3;
          }
          uVar21 = local_248;
          if ((local_4e8 & 1) != 0) {
            uVar21 = 0;
          }
          sVar14 = uVar21 + lVar16;
        }
      }
      else {
        if (local_440 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x277b,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        sVar14 = 1;
      }
    }
    sVar8 = uVar27 + 1;
    sVar9 = ZSTD_estimateSubBlockSize_symbolType
                      (local_23c,local_4d0,0x1f,sVar8,local_4d8->offcodeCTable,(U32 *)0x0,
                       OF_defaultNorm,5,workspace,uVar32);
    sVar10 = ZSTD_estimateSubBlockSize_symbolType
                       (local_240,local_4c0,0x23,sVar8,local_468,LL_bits,LL_defaultNorm,6,workspace,
                        uVar32);
    puVar18 = local_4c8;
    sVar11 = ZSTD_estimateSubBlockSize_symbolType
                       (local_238,(BYTE *)local_4c8,0x34,sVar8,local_470,ML_bits,ML_defaultNorm,6,
                        workspace,uVar32);
    uVar21 = local_248;
    piVar28 = local_4f0;
    pbVar29 = (byte *)0x0;
    if ((local_4e8 & 1) == 0) {
      pbVar29 = local_40;
    }
    if ((local_448 < pbVar29 + sVar14 + sVar10 + sVar11 + sVar9 + 6) ||
       ((ZSTD_compressedBlockState_t *)(sstart + uVar27 + 1) == local_510)) {
      if (uVar27 < 0x7fffffffffffffff) {
        pBVar6 = (BYTE *)0x0;
        pUVar12 = local_450;
        pZVar19 = local_4b8;
        do {
          puVar18 = (uint *)(ulong)*pUVar12;
          pBVar6 = (BYTE *)((long)puVar18 + (long)(pBVar6 + 3));
          pZVar19 = (ZSTD_fseCTables_t *)((long)pZVar19 + -8);
          pUVar12 = pUVar12 + 4;
        } while (0 < (long)pZVar19);
      }
      else {
        pBVar6 = (BYTE *)0x0;
      }
      bVar30 = (ZSTD_compressedBlockState_t *)(sstart + uVar27 + 1) == local_510;
      bVar31 = local_45c != 0;
      lVar16 = ((ulong)(0x3ff < sVar7) + 1) - (ulong)(sVar7 < 0x4000);
      if (((byte)local_4ac & sVar7 == 0) == 0) {
        local_501 = bVar30;
        if (sVar7 == 0) {
          if (local_478 == (BYTE *)0x0) {
            return 0xffffffffffffffba;
          }
          *(undefined1 *)local_4f0 = 0;
          puVar13 = (undefined1 *)0x1;
        }
        else if (local_440 == 1) {
          uVar32 = 0x10ec32;
          puVar13 = (undefined1 *)
                    ZSTD_compressRleLiteralsBlock(local_4f0,(size_t)puVar18,local_4e0,sVar7);
        }
        else {
          if (local_440 == 0) {
            uVar32 = 0x10ebcf;
            puVar13 = (undefined1 *)
                      ZSTD_noCompressLiterals(local_4f0,(size_t)local_478,local_4e0,sVar7);
          }
          else {
            puVar13 = (undefined1 *)((long)local_4f0 + lVar16 + 3);
            bVar2 = lVar16 != 0;
            if ((local_4ac & 1) == 0) {
              local_4a8 = 0;
            }
            else {
              local_502 = bVar2;
              memcpy(puVar13,local_43c,local_248);
              local_4a8 = uVar21;
              puVar13 = puVar13 + uVar21;
              bVar2 = local_502;
            }
            if ((0xff < sVar7 & bVar2) == 0) {
              uVar32 = 0x10ef71;
              sVar14 = HUF_compress1X_usingCTable_internal
                                 (puVar13,(long)local_4f8 - (long)puVar13,local_4e0,sVar7,
                                  (HUF_CElt *)local_480,0);
            }
            else {
              uVar32 = 0x10ef5a;
              sVar14 = HUF_compress4X_usingCTable_internal
                                 (puVar13,(long)local_4f8 - (long)puVar13,local_4e0,sVar7,
                                  (HUF_CElt *)local_480,0);
            }
            if (0xffffffffffffff87 < sVar14 - 1) goto LAB_0010eb7e;
            uVar27 = local_4a8 + sVar14;
            if (sVar7 < uVar27 && (local_4ac & 1) == 0) {
              uVar32 = 0x10eff5;
              puVar13 = (undefined1 *)
                        ZSTD_noCompressLiterals(local_4f0,(size_t)local_478,local_4e0,sVar7);
            }
            else {
              if (sVar7 < uVar27) goto LAB_0010eb7e;
              uVar15 = (int)sVar7 << 4;
              uVar3 = (uint)uVar27;
              if (lVar16 == 2) {
                *(uint *)(local_4a0 + 3) = (uVar15 | local_4b0) + uVar3 * 0x400000 + 0xc;
                local_4a0[7] = (BYTE)(uVar3 >> 10);
              }
              else if (lVar16 == 1) {
                *local_4f0 = (uVar15 | local_4b0) + uVar3 * 0x40000 + 8;
              }
              else {
                iVar5 = uVar3 * 0x4000 + (uVar15 | local_4b0);
                *(short *)(local_4a0 + 3) = (short)iVar5;
                local_4a0[5] = (BYTE)((uint)iVar5 >> 0x10);
              }
              puVar13 = puVar13 + (sVar14 - (long)local_4f0);
            }
          }
          if ((undefined1 *)0xffffffffffffff88 < puVar13) {
            return (size_t)puVar13;
          }
          piVar28 = local_4f0;
          if (puVar13 == (undefined1 *)0x0) goto LAB_0010eb7e;
        }
        pbVar29 = local_40;
        pbVar20 = puVar13 + (long)piVar28;
        bVar30 = 0x39 < (local_490->appliedParams).cParams.windowLog;
        if ((long)local_4f8 - (long)pbVar20 < 4) {
          return 0xffffffffffffffba;
        }
        if (sVar8 < 0x7f) {
          *pbVar20 = (byte)sVar8;
          if (sVar8 != 0) {
            pbVar22 = pbVar20 + 1;
            pbVar25 = pbVar20 + 2;
            goto LAB_0010ed44;
          }
          pbVar29 = (byte *)(ulong)((sVar8 != 0 | (byte)local_4e8) & 1);
LAB_0010eec5:
          if (pbVar29 == (byte *)0x0) goto LAB_0010eb7e;
          pbVar26 = pbVar20 + (long)pbVar29 + -(long)local_4a0;
          iVar5 = (bVar31 & local_501 | 0xffffffec) + (int)pbVar26 * 8;
          *(short *)local_4a0 = (short)iVar5;
          local_4a0[2] = (BYTE)((uint)iVar5 >> 0x10);
          puVar18 = (uint *)local_4a0;
        }
        else {
          if (sVar8 < 0x7f00) {
            bVar2 = (byte)(sVar8 >> 8) | 0x80;
            pbVar20[1] = (byte)sVar8;
            lVar16 = 2;
          }
          else {
            *(short *)(pbVar20 + 1) = (short)sVar8 + -0x7f00;
            bVar2 = 0xff;
            lVar16 = 3;
          }
          pbVar22 = pbVar20 + lVar16;
          *pbVar20 = bVar2;
          pbVar25 = pbVar20 + lVar16 + 1;
LAB_0010ed44:
          local_4a8 = CONCAT71(local_4a8._1_7_,bVar31);
          if ((local_4e8 & 1) == 0) {
            *pbVar22 = (char)(local_23c << 4) + (char)(local_240 << 6) + (char)local_238 * '\x04';
            memcpy(pbVar25,local_234,(size_t)local_40);
            pbVar25 = pbVar25 + (long)pbVar29;
            uVar32 = local_458;
            sVar14 = ZSTD_encodeSequences
                               (pbVar25,(long)local_4f8 - (long)pbVar25,local_470,(BYTE *)local_4c8,
                                local_4d8->offcodeCTable,local_4d0,local_468,local_4c0,sstart,sVar8,
                                (uint)bVar30,(int)local_458);
            if (0xffffffffffffff88 < sVar14) {
              return sVar14;
            }
            pbVar25 = pbVar25 + sVar14;
            if (local_38 == 0) {
              puVar18 = (uint *)0x0;
            }
            else {
              puVar18 = (uint *)(local_38 + sVar14);
              if (puVar18 < (BYTE *)0x4) {
                if (puVar18 != (uint *)0x3) {
                  __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2726,
                                "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int)"
                               );
                }
                goto LAB_0010eb7e;
              }
            }
          }
          else {
            *pbVar22 = 0xfc;
            puVar18 = local_4c8;
            uVar32 = local_458;
            sVar14 = ZSTD_encodeSequences
                               (pbVar25,(long)local_4f8 - (long)pbVar25,local_470,(BYTE *)local_4c8,
                                local_4d8->offcodeCTable,local_4d0,local_468,local_4c0,sstart,sVar8,
                                (uint)bVar30,(int)local_458);
            if (0xffffffffffffff88 < sVar14) {
              return sVar14;
            }
            pbVar25 = pbVar25 + sVar14;
          }
          pbVar26 = pbVar25 + -(long)pbVar20;
          pbVar29 = (byte *)0x0;
          if (3 < (long)pbVar25 - (long)pbVar22) {
            pbVar29 = pbVar26;
          }
          bVar31 = (byte)local_4a8;
          if (pbVar29 < (byte *)0xffffffffffffff89) goto LAB_0010eec5;
        }
        if ((byte *)0xffffffffffffff88 < pbVar26) {
          return (size_t)pbVar26;
        }
        if ((pbVar26 != (byte *)0x0) && (pbVar29 = pBVar6 + sVar7, pbVar26 < pbVar29)) break;
      }
      else {
        sVar7 = 0;
      }
    }
LAB_0010eb7e:
    local_4b8 = (ZSTD_fseCTables_t *)((long)local_4b8 + 8);
    uVar27 = sVar8;
    if (local_510 <= sstart + sVar8) goto LAB_0010f0dc;
  } while( true );
  bVar30 = local_488 < pbVar29;
  local_488 = local_488 + -(long)pbVar29;
  if (bVar30) {
    __assert_fail("remaining >= decompressedSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x280a,
                  "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_entropyCTables_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const int, U32, void *, size_t)"
                 );
  }
  sstart = sstart + sVar8;
  local_4e0 = local_4e0 + sVar7;
  local_4a0 = local_4a0 + (long)pbVar26;
  local_4c0 = local_4c0 + sVar8;
  local_4c8 = (uint *)((long)local_4c8 + sVar8);
  local_4d0 = local_4d0 + sVar8;
  local_4e8 = CONCAT71((int7)((ulong)puVar18 >> 8),1);
  uVar17 = 0;
  if (local_510 <= sstart) goto LAB_0010f0dc;
  goto LAB_0010e8c0;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildSuperBlockEntropy(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */));

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            &zc->blockState.nextCBlock->entropy,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}